

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

uint __thiscall llvm::ARM::parseArchExt(ARM *this,StringRef ArchExt)

{
  char *pcVar1;
  bool bVar2;
  StringRef SVar3;
  char *local_e8;
  char *local_e0;
  undefined1 local_c8 [8];
  anon_struct_40_5_444f9c93 A;
  anon_struct_40_5_444f9c93 *__end1;
  anon_struct_40_5_444f9c93 *__begin1;
  anon_struct_40_5_444f9c93 (*__range1) [21];
  StringRef ArchExt_local;
  ARM *local_50;
  char *local_48;
  ARM **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  ARM *local_18;
  int local_c;
  
  pcVar1 = ArchExt.Data;
  __end1 = (anon_struct_40_5_444f9c93 *)(anonymous_namespace)::ARCHExtNames;
  A.NegFeature = "";
  while( true ) {
    if (__end1 == (anon_struct_40_5_444f9c93 *)A.NegFeature) {
      return 0;
    }
    memcpy(local_c8,__end1,0x28);
    SVar3 = anon_unknown.dwarf_2b9344::anon_struct_40_5_444f9c93::getName
                      ((anon_struct_40_5_444f9c93 *)local_c8);
    local_e8 = SVar3.Data;
    local_e0 = (char *)SVar3.Length;
    local_38 = local_e8;
    local_30 = local_e0;
    local_40 = &local_50;
    bVar2 = false;
    local_50 = this;
    local_48 = pcVar1;
    if (pcVar1 == local_e0) {
      local_20 = local_e8;
      local_28 = local_e0;
      local_18 = this;
      if (local_e0 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(this,local_e8,(size_t)local_e0);
      }
      bVar2 = local_c == 0;
    }
    if (bVar2) break;
    __end1 = __end1 + 1;
  }
  return (uint)A.NameLength;
}

Assistant:

unsigned llvm::ARM::parseArchExt(StringRef ArchExt) {
  for (const auto A : ARCHExtNames) {
    if (ArchExt == A.getName())
      return A.ID;
  }
  return ARM::AEK_INVALID;
}